

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

bool __thiscall
Memory::LargeHeapBlock::RescanOnePage(LargeHeapBlock *this,Recycler *recycler,RescanFlags flags)

{
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  LargeObjectHeader *this_00;
  LargeHeapBlock *this_01;
  RescanFlags flags_00;
  LargeHeapBlock *this_02;
  uint objectIndex;
  uint index;
  ulong byteCount;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar6 [16];
  
  if (this->pageCount != 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x4d0,"(this->GetPageCount() == 1)","this->GetPageCount() == 1");
    if (!bVar3) {
LAB_0065d67e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar3 = (this->super_HeapBlock).needOOMRescan;
  (this->super_HeapBlock).needOOMRescan = false;
  if (bVar3 == false) {
    if (recycler->inEndMarkOnLowMemory == false) {
      this_01 = (LargeHeapBlock *)GetHeaderByIndex(this,0);
      if (this_01 == (LargeHeapBlock *)0x0) {
        return false;
      }
      this_02 = this_01;
      bVar4 = LargeObjectHeader::GetAttributes
                        ((LargeObjectHeader *)this_01,this->heapInfo->recycler->Cookie);
      if (((bVar4 & 0x20) == 0) &&
         (bVar3 = IsPageDirty(this_02,(this->super_HeapBlock).address,flags_00,
                              (bool)(((this_01->super_HeapBlock).isPendingConcurrentSweep & 2U) >> 1
                                    )), bVar3)) goto LAB_0065d4b0;
    }
    bVar3 = false;
  }
  else {
LAB_0065d4b0:
    psVar1 = &(recycler->collectionStats).markData.rescanLargePageCount;
    *psVar1 = *psVar1 + 1;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    auVar6._8_8_ = extraout_XMM1_Qb;
    auVar6._0_8_ = extraout_XMM1_Qa;
    for (index = 0; index < this->allocCount; index = index + 1) {
      this_00 = GetHeaderByIndex(this,index);
      if (this_00 != (LargeObjectHeader *)0x0) {
        bVar3 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,this_00 + 1);
        if (bVar3) {
          bVar4 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
          if ((bVar4 & 4) != 0 && (char)bVar4 < '\0') {
            psVar1 = &(recycler->collectionStats).finalizeCount;
            *psVar1 = *psVar1 + 1;
            LargeObjectHeader::SetAttributes(this_00,recycler->Cookie,bVar4 & 0xfb);
          }
          if ((bVar4 & 0x20) == 0) {
            byteCount = this_00->objectSize;
            auVar6 = pmovsxbq(auVar6,0x101);
            auVar6._0_8_ = auVar6._0_8_ +
                           (recycler->collectionStats).markData.rescanLargeObjectCount;
            auVar6._8_8_ = byteCount + (recycler->collectionStats).markData.rescanLargeByteCount;
            (recycler->collectionStats).markData.rescanLargeObjectCount = auVar6._0_8_;
            (recycler->collectionStats).markData.rescanLargeByteCount = auVar6._8_8_;
            if ((this->pageHeapData != (PageHeapData *)0x0) &&
               (this->pageHeapData->pageHeapMode != PageHeapModeOff)) {
              byteCount = byteCount & 0xfffffffffffffff8;
            }
            if (byteCount != 0) {
              if ((bVar4 & 0x10) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                   ,0x53d,"(!(attributes & TrackBit))","!(attributes & TrackBit)");
                if (!bVar3) goto LAB_0065d67e;
                *puVar5 = 0;
              }
              bVar3 = Recycler::AddMark(recycler,this_00 + 1,byteCount);
              if (!bVar3) {
                HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,recycler);
              }
            }
          }
        }
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool
LargeHeapBlock::RescanOnePage(Recycler * recycler)
#endif
{
    Assert(this->GetPageCount() == 1);
    bool const oldNeedOOMRescan = this->needOOMRescan;

    // Reset this, we'll increment this if we OOM again
    this->needOOMRescan = false;

#if ENABLE_CONCURRENT_GC
    // don't need to get the write watch bit if we already need to oom rescan
    if (!oldNeedOOMRescan)
    {
        if (recycler->inEndMarkOnLowMemory)
        {
            // we only do oom rescan if we are on low memory mark
            return false;
        }

        // Check the write watch bit to see if we need to rescan
        // REVIEW: large object size if bigger than one page, to use header index 0 here should be OK
        LargeObjectHeader* header = this->GetHeaderByIndex(0);
        if (header == nullptr) // not allocated or it's pending dispose or disposed
        {
            return false;
        }
        if((header->GetAttributes(this->heapInfo->recycler->Cookie) & LeafBit) == LeafBit)
        {
            return false;
        }
        bool hasWriteBarrier = false;
#ifdef RECYCLER_WRITE_BARRIER
        hasWriteBarrier = header->hasWriteBarrier;
#endif
        if (!IsPageDirty(this->GetBeginAddress(), flags, hasWriteBarrier))
        {
            return false;
        }
    }
#else
    // Shouldn't be rescanning in cases other than OOM if GetWriteWatch
    Assert(oldNeedOOMRescan);
#endif

    RECYCLER_STATS_INC(recycler, markData.rescanLargePageCount);

    for (uint objectIndex = 0; objectIndex < allocCount; objectIndex++)
    {
        // object is allocated during the concurrent mark or it is marked, do rescan
        LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);

        // check if the object index is not allocated
        if (header == nullptr)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();

        // it is not marked, don't rescan
        if (!recycler->heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        unsigned char attributes = header->GetAttributes(this->heapInfo->recycler->Cookie);

#ifdef RECYCLER_STATS
        if (((attributes & FinalizeBit) != 0) && ((attributes & NewFinalizeBit) != 0))
        {
            // The concurrent thread saw a false reference to this object and marked it before the attribute was set.
            // As such, our finalizeCount is not correct. Update it now.

            RECYCLER_STATS_INC(recycler, finalizeCount);
            header->SetAttributes(recycler->Cookie, (attributes & ~NewFinalizeBit));
        }
#endif

        // check whether the object is a leaf and doesn't need to be scanned
        if ((attributes & LeafBit) != 0)
        {
            continue;
        }

        RECYCLER_STATS_INC(recycler, markData.rescanLargeObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanLargeByteCount, header->objectSize);

        size_t objectSize = header->objectSize;
#ifdef RECYCLER_PAGE_HEAP
        if (this->InPageHeapMode())
        {
            // trim off the trailing part which is not a pointer
            objectSize = HeapInfo::RoundObjectSize(objectSize);
        }
#endif
        if (objectSize > 0) // otherwise the object total size is less than a pointer size
        {
            bool noOOMDuringMark = true;
#ifdef RECYCLER_VISITED_HOST
            if (attributes & TrackBit)
            {
                noOOMDuringMark = recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddress));
                if (noOOMDuringMark)
                {
                    // Object has been successfully processed, so clear NewTrackBit
                    header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                    RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                }
            }
            else
#endif
            {
                Assert(!(attributes & TrackBit));
                noOOMDuringMark = recycler->AddMark(objectAddress, objectSize);
            }

            if (!noOOMDuringMark)
            {
                this->SetNeedOOMRescan(recycler);
            }
        }
    }
    return true;
}